

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

t_iemgui * iemgui_new(_class *cls)

{
  t_iemgui *ptVar1;
  _glist *p_Var2;
  _iemgui_private *p_Var3;
  int local_28;
  int fs;
  _glist *cnv;
  t_iemgui *x;
  _class *cls_local;
  
  ptVar1 = (t_iemgui *)pd_new(cls);
  p_Var2 = canvas_getcurrent();
  local_28 = p_Var2->gl_font;
  ptVar1->x_glist = p_Var2;
  p_Var3 = (_iemgui_private *)getbytes(0x40);
  ptVar1->x_private = p_Var3;
  ptVar1->x_draw = iemgui_draw;
  if (local_28 < 4) {
    local_28 = 4;
  }
  ptVar1->x_fontsize = local_28;
  iem_inttosymargs(&ptVar1->x_isa,0);
  iem_inttofstyle(&ptVar1->x_fsf,0);
  ptVar1->x_bcol = 0xfcfcfc;
  ptVar1->x_fcol = 0;
  ptVar1->x_lcol = 0;
  return ptVar1;
}

Assistant:

t_iemgui *iemgui_new(t_class*cls)
{
    t_iemgui *x = (t_iemgui *)pd_new(cls);
    t_glist *cnv = canvas_getcurrent();
    int fs = cnv->gl_font;
    x->x_glist = cnv;
    x->x_private = (t_iemgui_private*)getbytes(sizeof(*x->x_private));
    x->x_draw = (t_iemfunptr)iemgui_draw;

    x->x_fontsize = (fs<4)?4:fs;
/*
    int fs = x->x_gui.x_fontsize;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;
*/
    iem_inttosymargs(&x->x_isa, 0);
    iem_inttofstyle(&x->x_fsf, 0);

    x->x_bcol = 0xFCFCFC;
    x->x_fcol = 0x00;
    x->x_lcol = 0x00;

    return x;
}